

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O2

int simplerng_poisson_small(double lambda)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = exp(-lambda);
  dVar3 = 1.0;
  iVar1 = -1;
  do {
    dVar4 = simplerng_getuniform();
    dVar3 = dVar3 * dVar4;
    iVar1 = iVar1 + 1;
  } while (dVar2 < dVar3);
  return iVar1;
}

Assistant:

int simplerng_poisson_small(double lambda)
{
  /* Algorithm due to Donald Knuth, 1969. */
  double p = 1.0, L = exp(-lambda);
  int k = 0;
  do {
    k++;
    p *= simplerng_getuniform();
  }
  while (p > L);
  return k - 1;
}